

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

ResetPtr createInitialisedReset(void)

{
  string *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  ResetPtr RVar3;
  VariablePtr tv1;
  VariablePtr v1;
  long *local_58 [2];
  long local_48 [2];
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  string local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Reset::create();
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"vA","");
  libcellml::Variable::create(local_28);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"vTest","");
  libcellml::Variable::create(local_38);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  libcellml::Reset::setOrder((int)*(undefined8 *)in_RDI);
  psVar1 = *(string **)in_RDI;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"reset value math","");
  libcellml::Reset::setResetValue(psVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  psVar1 = *(string **)in_RDI;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"rv_id","");
  libcellml::Reset::setResetValueId(psVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  psVar1 = *(string **)in_RDI;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"test value math","");
  libcellml::Reset::setTestValue(psVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  psVar1 = *(string **)in_RDI;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"tv_id","");
  libcellml::Reset::setTestValueId(psVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  libcellml::Reset::setTestVariable(*(shared_ptr **)in_RDI);
  libcellml::Reset::setVariable(*(shared_ptr **)in_RDI);
  _Var2._M_pi = extraout_RDX;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var2._M_pi = extraout_RDX_01;
  }
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ResetPtr)RVar3.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ResetPtr createInitialisedReset()
{
    libcellml::ResetPtr r = libcellml::Reset::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create("vA");
    libcellml::VariablePtr tv1 = libcellml::Variable::create("vTest");

    r->setOrder(3);
    r->setResetValue("reset value math");
    r->setResetValueId("rv_id");
    r->setTestValue("test value math");
    r->setTestValueId("tv_id");
    r->setTestVariable(tv1);
    r->setVariable(v1);

    return r;
}